

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_fullgc(lua_State *L,int isemergency)

{
  lu_byte lVar1;
  global_State *g_00;
  global_State *g;
  int isemergency_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  g._4_1_ = (lu_byte)isemergency;
  g_00->gcemergency = g._4_1_;
  lVar1 = g_00->gckind;
  if (lVar1 == '\0') {
    fullinc(L,g_00);
  }
  else if (lVar1 == '\x01') {
    fullgen(L,g_00);
  }
  else if (lVar1 == '\x02') {
    g_00->gckind = '\0';
    fullinc(L,g_00);
    g_00->gckind = '\x02';
  }
  g_00->gcemergency = '\0';
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  g->gcemergency = cast_byte(isemergency);  /* set flag */
  switch (g->gckind) {
    case KGC_GENMINOR: fullgen(L, g); break;
    case KGC_INC: fullinc(L, g); break;
    case KGC_GENMAJOR:
      g->gckind = KGC_INC;
      fullinc(L, g);
      g->gckind = KGC_GENMAJOR;
      break;
  }
  g->gcemergency = 0;
}